

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalFrames(Wal *pWal,int szPage,PgHdr *pList,Pgno nTruncate,int isCommit,int sync_flags)

{
  int iVar1;
  WalIndexHdr *__s2;
  bool bVar2;
  Pgno local_ec;
  i64 local_e8;
  i64 sz;
  int sectorSize;
  int bSync;
  void *pData;
  i64 iOff;
  u32 iWrite;
  int nDbSize;
  u32 aCksum [2];
  u8 aWalHdr [32];
  WalIndexHdr *pLive;
  undefined1 auStack_80 [4];
  u32 iFirst;
  WalWriter w;
  i64 iOffset;
  int szFrame;
  int nExtra;
  PgHdr *pLast;
  PgHdr *p;
  int local_38;
  u32 iFrame;
  int rc;
  int sync_flags_local;
  int isCommit_local;
  Pgno nTruncate_local;
  PgHdr *pList_local;
  int szPage_local;
  Wal *pWal_local;
  
  _szFrame = (PgHdr *)0x0;
  iOffset._4_4_ = 0;
  pLive._4_4_ = 0;
  __s2 = walIndexHdr(pWal);
  iVar1 = memcmp(&pWal->hdr,__s2,0x30);
  if (iVar1 != 0) {
    pLive._4_4_ = __s2->mxFrame + 1;
  }
  local_38 = walRestartLog(pWal);
  pWal_local._4_4_ = local_38;
  if (local_38 == 0) {
    p._4_4_ = (pWal->hdr).mxFrame;
    if (p._4_4_ == 0) {
      sqlite3Put4byte((uchar *)aCksum,0x377f0682);
      sqlite3Put4byte((uchar *)(aCksum + 1),0x2de218);
      sqlite3Put4byte(aWalHdr,szPage);
      sqlite3Put4byte(aWalHdr + 4,pWal->nCkpt);
      if (pWal->nCkpt == 0) {
        sqlite3_randomness(8,(pWal->hdr).aSalt);
      }
      aWalHdr._8_8_ = *(undefined8 *)(pWal->hdr).aSalt;
      walChecksumBytes(1,(u8 *)aCksum,0x18,(u32 *)0x0,&iWrite);
      sqlite3Put4byte(aWalHdr + 0x10,iWrite);
      sqlite3Put4byte(aWalHdr + 0x14,nDbSize);
      pWal->szPage = szPage;
      (pWal->hdr).bigEndCksum = '\0';
      (pWal->hdr).aFrameCksum[0] = iWrite;
      (pWal->hdr).aFrameCksum[1] = nDbSize;
      pWal->truncateOnCommit = '\x01';
      iVar1 = sqlite3OsWrite(pWal->pWalFd,aCksum,0x20,0);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_38 = 0;
      if ((pWal->syncHeader != '\0') &&
         (local_38 = sqlite3OsSync(pWal->pWalFd,sync_flags >> 2 & 3), local_38 != 0)) {
        return local_38;
      }
    }
    w.pWal = (Wal *)pWal->pWalFd;
    w.pFd = (sqlite3_file *)0x0;
    w._24_8_ = (ulong)p._4_4_ * (long)(szPage + 0x18) + 0x20;
    _auStack_80 = pWal;
    w.iSyncPoint._0_4_ = sync_flags;
    w.iSyncPoint._4_4_ = szPage;
    for (pLast = pList; pLast != (PgHdr *)0x0; pLast = pLast->pDirty) {
      if ((pLive._4_4_ == 0) || ((pLast->pDirty == (PgHdr *)0x0 && (isCommit != 0)))) {
LAB_001d4b6e:
        p._4_4_ = p._4_4_ + 1;
        if ((isCommit == 0) || (local_ec = nTruncate, pLast->pDirty != (PgHdr *)0x0)) {
          local_ec = 0;
        }
        iOff._4_4_ = local_ec;
        iVar1 = walWriteOneFrame((WalWriter *)auStack_80,pLast,local_ec,w._24_8_);
        if (iVar1 != 0) {
          return iVar1;
        }
        _szFrame = pLast;
        w._24_8_ = (long)(szPage + 0x18) + w._24_8_;
        pLast->flags = pLast->flags | 0x40;
      }
      else {
        iOff._0_4_ = 0;
        sqlite3WalFindFrame(pWal,pLast->pgno,(u32 *)&iOff);
        if ((uint)iOff < pLive._4_4_) goto LAB_001d4b6e;
        if ((pWal->iReCksum == 0) || ((uint)iOff < pWal->iReCksum)) {
          pWal->iReCksum = (uint)iOff;
        }
        iVar1 = sqlite3OsWrite(pWal->pWalFd,pLast->pData,szPage,
                               (ulong)((uint)iOff - 1) * (long)(szPage + 0x18) + 0x38);
        if (iVar1 != 0) {
          return iVar1;
        }
        pLast->flags = pLast->flags & 0xffbf;
      }
      local_38 = 0;
    }
    if (((isCommit == 0) || (pWal->iReCksum == 0)) ||
       (local_38 = walRewriteChecksums(pWal,p._4_4_), pWal_local._4_4_ = local_38, local_38 == 0)) {
      if ((isCommit != 0) && ((sync_flags & 3U) != 0)) {
        bVar2 = true;
        if (pWal->padToSectorBoundary != '\0') {
          iVar1 = sqlite3SectorSize(pWal->pWalFd);
          w.pFd = (sqlite3_file *)(((w._24_8_ + (long)iVar1 + -1) / (long)iVar1) * (long)iVar1);
          bVar2 = w.pFd == (sqlite3_file *)w._24_8_;
          for (; (long)w._24_8_ < (long)w.pFd; w._24_8_ = (long)(szPage + 0x18) + w._24_8_) {
            iVar1 = walWriteOneFrame((WalWriter *)auStack_80,_szFrame,nTruncate,w._24_8_);
            if (iVar1 != 0) {
              return iVar1;
            }
            iOffset._4_4_ = iOffset._4_4_ + 1;
            local_38 = 0;
          }
        }
        if (bVar2) {
          local_38 = sqlite3OsSync((sqlite3_file *)w.pWal,sync_flags & 3);
        }
      }
      if (((isCommit != 0) && (pWal->truncateOnCommit != '\0')) && (-1 < pWal->mxWalSize)) {
        local_e8 = pWal->mxWalSize;
        if (pWal->mxWalSize <
            (long)((ulong)(p._4_4_ + iOffset._4_4_) * (long)(szPage + 0x18) + 0x20)) {
          local_e8 = (ulong)(p._4_4_ + iOffset._4_4_) * (long)(szPage + 0x18) + 0x20;
        }
        walLimitSize(pWal,local_e8);
        pWal->truncateOnCommit = '\0';
      }
      p._4_4_ = (pWal->hdr).mxFrame;
      for (pLast = pList; pLast != (PgHdr *)0x0 && local_38 == 0; pLast = pLast->pDirty) {
        if ((pLast->flags & 0x40) != 0) {
          p._4_4_ = p._4_4_ + 1;
          local_38 = walIndexAppend(pWal,p._4_4_,pLast->pgno);
        }
      }
      while (local_38 == 0 && 0 < iOffset._4_4_) {
        p._4_4_ = p._4_4_ + 1;
        iOffset._4_4_ = iOffset._4_4_ + -1;
        local_38 = walIndexAppend(pWal,p._4_4_,_szFrame->pgno);
      }
      if (local_38 == 0) {
        (pWal->hdr).szPage = (ushort)szPage & 0xff00 | (ushort)((uint)szPage >> 0x10);
        (pWal->hdr).mxFrame = p._4_4_;
        if (isCommit != 0) {
          (pWal->hdr).iChange = (pWal->hdr).iChange + 1;
          (pWal->hdr).nPage = nTruncate;
          walIndexWriteHdr(pWal);
          pWal->iCallback = p._4_4_;
        }
      }
      pWal_local._4_4_ = local_38;
    }
  }
  return pWal_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFrames(
  Wal *pWal,                      /* Wal handle to write to */
  int szPage,                     /* Database page-size in bytes */
  PgHdr *pList,                   /* List of dirty pages to write */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit,                   /* True if this is a commit */
  int sync_flags                  /* Flags to pass to OsSync() (or 0) */
){
  int rc;                         /* Used to catch return codes */
  u32 iFrame;                     /* Next frame address */
  PgHdr *p;                       /* Iterator to run through pList with. */
  PgHdr *pLast = 0;               /* Last frame in list */
  int nExtra = 0;                 /* Number of extra copies of last page */
  int szFrame;                    /* The size of a single frame */
  i64 iOffset;                    /* Next byte to write in WAL file */
  WalWriter w;                    /* The writer */
  u32 iFirst = 0;                 /* First frame that may be overwritten */
  WalIndexHdr *pLive;             /* Pointer to shared header */

  assert( pList );
  assert( pWal->writeLock );

  /* If this frame set completes a transaction, then nTruncate>0.  If
  ** nTruncate==0 then this frame set does not complete the transaction. */
  assert( (isCommit!=0)==(nTruncate!=0) );

#if defined(SQLITE_TEST) && defined(SQLITE_DEBUG)
  { int cnt; for(cnt=0, p=pList; p; p=p->pDirty, cnt++){}
    WALTRACE(("WAL%p: frame write begin. %d frames. mxFrame=%d. %s\n",
              pWal, cnt, pWal->hdr.mxFrame, isCommit ? "Commit" : "Spill"));
  }
#endif

  pLive = (WalIndexHdr*)walIndexHdr(pWal);
  if( memcmp(&pWal->hdr, (void *)pLive, sizeof(WalIndexHdr))!=0 ){
    iFirst = pLive->mxFrame+1;
  }

  /* See if it is possible to write these frames into the start of the
  ** log file, instead of appending to it at pWal->hdr.mxFrame.
  */
  if( SQLITE_OK!=(rc = walRestartLog(pWal)) ){
    return rc;
  }

  /* If this is the first frame written into the log, write the WAL
  ** header to the start of the WAL file. See comments at the top of
  ** this source file for a description of the WAL header format.
  */
  iFrame = pWal->hdr.mxFrame;
  if( iFrame==0 ){
    u8 aWalHdr[WAL_HDRSIZE];      /* Buffer to assemble wal-header in */
    u32 aCksum[2];                /* Checksum for wal-header */

    sqlite3Put4byte(&aWalHdr[0], (WAL_MAGIC | SQLITE_BIGENDIAN));
    sqlite3Put4byte(&aWalHdr[4], WAL_MAX_VERSION);
    sqlite3Put4byte(&aWalHdr[8], szPage);
    sqlite3Put4byte(&aWalHdr[12], pWal->nCkpt);
    if( pWal->nCkpt==0 ) sqlite3_randomness(8, pWal->hdr.aSalt);
    memcpy(&aWalHdr[16], pWal->hdr.aSalt, 8);
    walChecksumBytes(1, aWalHdr, WAL_HDRSIZE-2*4, 0, aCksum);
    sqlite3Put4byte(&aWalHdr[24], aCksum[0]);
    sqlite3Put4byte(&aWalHdr[28], aCksum[1]);

    pWal->szPage = szPage;
    pWal->hdr.bigEndCksum = SQLITE_BIGENDIAN;
    pWal->hdr.aFrameCksum[0] = aCksum[0];
    pWal->hdr.aFrameCksum[1] = aCksum[1];
    pWal->truncateOnCommit = 1;

    rc = sqlite3OsWrite(pWal->pWalFd, aWalHdr, sizeof(aWalHdr), 0);
    WALTRACE(("WAL%p: wal-header write %s\n", pWal, rc ? "failed" : "ok"));
    if( rc!=SQLITE_OK ){
      return rc;
    }

    /* Sync the header (unless SQLITE_IOCAP_SEQUENTIAL is true or unless
    ** all syncing is turned off by PRAGMA synchronous=OFF).  Otherwise
    ** an out-of-order write following a WAL restart could result in
    ** database corruption.  See the ticket:
    **
    **     https://sqlite.org/src/info/ff5be73dee
    */
    if( pWal->syncHeader ){
      rc = sqlite3OsSync(pWal->pWalFd, CKPT_SYNC_FLAGS(sync_flags));
      if( rc ) return rc;
    }
  }
  assert( (int)pWal->szPage==szPage );

  /* Setup information needed to write frames into the WAL */
  w.pWal = pWal;
  w.pFd = pWal->pWalFd;
  w.iSyncPoint = 0;
  w.syncFlags = sync_flags;
  w.szPage = szPage;
  iOffset = walFrameOffset(iFrame+1, szPage);
  szFrame = szPage + WAL_FRAME_HDRSIZE;

  /* Write all frames into the log file exactly once */
  for(p=pList; p; p=p->pDirty){
    int nDbSize;   /* 0 normally.  Positive == commit flag */

    /* Check if this page has already been written into the wal file by
    ** the current transaction. If so, overwrite the existing frame and
    ** set Wal.writeLock to WAL_WRITELOCK_RECKSUM - indicating that
    ** checksums must be recomputed when the transaction is committed.  */
    if( iFirst && (p->pDirty || isCommit==0) ){
      u32 iWrite = 0;
      VVA_ONLY(rc =) sqlite3WalFindFrame(pWal, p->pgno, &iWrite);
      assert( rc==SQLITE_OK || iWrite==0 );
      if( iWrite>=iFirst ){
        i64 iOff = walFrameOffset(iWrite, szPage) + WAL_FRAME_HDRSIZE;
        void *pData;
        if( pWal->iReCksum==0 || iWrite<pWal->iReCksum ){
          pWal->iReCksum = iWrite;
        }
        pData = p->pData;
        rc = sqlite3OsWrite(pWal->pWalFd, pData, szPage, iOff);
        if( rc ) return rc;
        p->flags &= ~PGHDR_WAL_APPEND;
        continue;
      }
    }

    iFrame++;
    assert( iOffset==walFrameOffset(iFrame, szPage) );
    nDbSize = (isCommit && p->pDirty==0) ? nTruncate : 0;
    rc = walWriteOneFrame(&w, p, nDbSize, iOffset);
    if( rc ) return rc;
    pLast = p;
    iOffset += szFrame;
    p->flags |= PGHDR_WAL_APPEND;
  }

  /* Recalculate checksums within the wal file if required. */
  if( isCommit && pWal->iReCksum ){
    rc = walRewriteChecksums(pWal, iFrame);
    if( rc ) return rc;
  }

  /* If this is the end of a transaction, then we might need to pad
  ** the transaction and/or sync the WAL file.
  **
  ** Padding and syncing only occur if this set of frames complete a
  ** transaction and if PRAGMA synchronous=FULL.  If synchronous==NORMAL
  ** or synchronous==OFF, then no padding or syncing are needed.
  **
  ** If SQLITE_IOCAP_POWERSAFE_OVERWRITE is defined, then padding is not
  ** needed and only the sync is done.  If padding is needed, then the
  ** final frame is repeated (with its commit mark) until the next sector
  ** boundary is crossed.  Only the part of the WAL prior to the last
  ** sector boundary is synced; the part of the last frame that extends
  ** past the sector boundary is written after the sync.
  */
  if( isCommit && WAL_SYNC_FLAGS(sync_flags)!=0 ){
    int bSync = 1;
    if( pWal->padToSectorBoundary ){
      int sectorSize = sqlite3SectorSize(pWal->pWalFd);
      w.iSyncPoint = ((iOffset+sectorSize-1)/sectorSize)*sectorSize;
      bSync = (w.iSyncPoint==iOffset);
      testcase( bSync );
      while( iOffset<w.iSyncPoint ){
        rc = walWriteOneFrame(&w, pLast, nTruncate, iOffset);
        if( rc ) return rc;
        iOffset += szFrame;
        nExtra++;
        assert( pLast!=0 );
      }
    }
    if( bSync ){
      assert( rc==SQLITE_OK );
      rc = sqlite3OsSync(w.pFd, WAL_SYNC_FLAGS(sync_flags));
    }
  }

  /* If this frame set completes the first transaction in the WAL and
  ** if PRAGMA journal_size_limit is set, then truncate the WAL to the
  ** journal size limit, if possible.
  */
  if( isCommit && pWal->truncateOnCommit && pWal->mxWalSize>=0 ){
    i64 sz = pWal->mxWalSize;
    if( walFrameOffset(iFrame+nExtra+1, szPage)>pWal->mxWalSize ){
      sz = walFrameOffset(iFrame+nExtra+1, szPage);
    }
    walLimitSize(pWal, sz);
    pWal->truncateOnCommit = 0;
  }

  /* Append data to the wal-index. It is not necessary to lock the
  ** wal-index to do this as the SQLITE_SHM_WRITE lock held on the wal-index
  ** guarantees that there are no other writers, and no data that may
  ** be in use by existing readers is being overwritten.
  */
  iFrame = pWal->hdr.mxFrame;
  for(p=pList; p && rc==SQLITE_OK; p=p->pDirty){
    if( (p->flags & PGHDR_WAL_APPEND)==0 ) continue;
    iFrame++;
    rc = walIndexAppend(pWal, iFrame, p->pgno);
  }
  assert( pLast!=0 || nExtra==0 );
  while( rc==SQLITE_OK && nExtra>0 ){
    iFrame++;
    nExtra--;
    rc = walIndexAppend(pWal, iFrame, pLast->pgno);
  }

  if( rc==SQLITE_OK ){
    /* Update the private copy of the header. */
    pWal->hdr.szPage = (u16)((szPage&0xff00) | (szPage>>16));
    testcase( szPage<=32768 );
    testcase( szPage>=65536 );
    pWal->hdr.mxFrame = iFrame;
    if( isCommit ){
      pWal->hdr.iChange++;
      pWal->hdr.nPage = nTruncate;
    }
    /* If this is a commit, update the wal-index header too. */
    if( isCommit ){
      walIndexWriteHdr(pWal);
      pWal->iCallback = iFrame;
    }
  }

  WALTRACE(("WAL%p: frame write %s\n", pWal, rc ? "failed" : "ok"));
  return rc;
}